

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void aarch64_sync_64_to_32_aarch64(CPUARMState_conflict *env)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint uVar3;
  long lVar4;
  uint32_t *puVar5;
  
  uVar3 = env->uncached_cpsr;
  lVar4 = 0;
  do {
    env->regs[lVar4] = (uint32_t)env->xregs[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  uVar3 = uVar3 & 0x1f;
  lVar4 = 0;
  if (uVar3 == 0x11) {
    do {
      env->usr_regs[lVar4] = (uint32_t)env->xregs[lVar4 + 8];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
  }
  else {
    do {
      env->regs[lVar4 + 8] = (uint32_t)env->xregs[lVar4 + 8];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
  }
  if ((uVar3 == 0x1f) || (uVar3 == 0x10)) {
    uVar2 = env->xregs[0xe];
    env->regs[0xd] = (uint32_t)env->xregs[0xd];
    env->regs[0xe] = (uint32_t)uVar2;
  }
  else {
    uVar1 = (uint32_t)env->xregs[0xe];
    env->banked_r13[0] = (uint32_t)env->xregs[0xd];
    if (uVar3 == 0x1a) {
      env->regs[0xe] = uVar1;
    }
    else {
      env->banked_r14[0] = uVar1;
    }
  }
  puVar5 = env->banked_r13 + 6;
  if (uVar3 == 0x1a) {
    puVar5 = env->regs + 0xd;
  }
  *puVar5 = (uint32_t)env->xregs[0xf];
  uVar1 = (uint32_t)env->xregs[0x10];
  if (uVar3 == 0x12) {
    env->regs[0xe] = uVar1;
    lVar4 = 0x34;
  }
  else {
    env->banked_r14[4] = uVar1;
    lVar4 = 0x1b0;
  }
  *(int *)((long)env->regs + lVar4) = (int)env->xregs[0x11];
  uVar1 = (uint32_t)env->xregs[0x12];
  if (uVar3 == 0x13) {
    env->regs[0xe] = uVar1;
    lVar4 = 0x34;
  }
  else {
    env->banked_r14[1] = uVar1;
    lVar4 = 0x1a4;
  }
  *(int *)((long)env->regs + lVar4) = (int)env->xregs[0x13];
  uVar1 = (uint32_t)env->xregs[0x14];
  if (uVar3 == 0x17) {
    env->regs[0xe] = uVar1;
    lVar4 = 0x34;
  }
  else {
    env->banked_r14[2] = uVar1;
    lVar4 = 0x1a8;
  }
  *(int *)((long)env->regs + lVar4) = (int)env->xregs[0x15];
  uVar1 = (uint32_t)env->xregs[0x16];
  if (uVar3 == 0x1b) {
    env->regs[0xe] = uVar1;
    lVar4 = 0x34;
  }
  else {
    env->banked_r14[3] = uVar1;
    lVar4 = 0x1ac;
  }
  *(int *)((long)env->regs + lVar4) = (int)env->xregs[0x17];
  if (uVar3 == 0x11) {
    lVar4 = 0;
    do {
      env->regs[lVar4 + 8] = (uint32_t)env->banked_spsr[lVar4 + -0xc];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
  }
  else {
    lVar4 = 0;
    do {
      env->fiq_regs[lVar4] = (uint32_t)env->banked_spsr[lVar4 + -0xc];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    uVar2 = env->xregs[0x1e];
    env->banked_r13[5] = (uint32_t)env->xregs[0x1d];
    env->banked_r14[5] = (uint32_t)uVar2;
  }
  env->regs[0xf] = (uint32_t)env->pc;
  return;
}

Assistant:

void aarch64_sync_64_to_32(CPUARMState *env)
{
    int i;
    uint32_t mode = env->uncached_cpsr & CPSR_M;

    /* We can blanket copy X[0:7] to R[0:7] */
    for (i = 0; i < 8; i++) {
        env->regs[i] = env->xregs[i];
    }

    /*
     * Unless we are in FIQ mode, r8-r12 come from the user registers x8-x12.
     * Otherwise, we copy x8-x12 into the banked user regs.
     */
    if (mode == ARM_CPU_MODE_FIQ) {
        for (i = 8; i < 13; i++) {
            env->usr_regs[i - 8] = env->xregs[i];
        }
    } else {
        for (i = 8; i < 13; i++) {
            env->regs[i] = env->xregs[i];
        }
    }

    /*
     * Registers r13 & r14 depend on the current mode.
     * If we are in a given mode, we copy the corresponding x registers to r13
     * and r14.  Otherwise, we copy the x register to the banked r13 and r14
     * for the mode.
     */
    if (mode == ARM_CPU_MODE_USR || mode == ARM_CPU_MODE_SYS) {
        env->regs[13] = env->xregs[13];
        env->regs[14] = env->xregs[14];
    } else {
        env->banked_r13[bank_number(ARM_CPU_MODE_USR)] = env->xregs[13];

        /*
         * HYP is an exception in that it does not have its own banked r14 but
         * shares the USR r14
         */
        if (mode == ARM_CPU_MODE_HYP) {
            env->regs[14] = env->xregs[14];
        } else {
            env->banked_r14[r14_bank_number(ARM_CPU_MODE_USR)] = env->xregs[14];
        }
    }

    if (mode == ARM_CPU_MODE_HYP) {
        env->regs[13] = env->xregs[15];
    } else {
        env->banked_r13[bank_number(ARM_CPU_MODE_HYP)] = env->xregs[15];
    }

    if (mode == ARM_CPU_MODE_IRQ) {
        env->regs[14] = env->xregs[16];
        env->regs[13] = env->xregs[17];
    } else {
        env->banked_r14[r14_bank_number(ARM_CPU_MODE_IRQ)] = env->xregs[16];
        env->banked_r13[bank_number(ARM_CPU_MODE_IRQ)] = env->xregs[17];
    }

    if (mode == ARM_CPU_MODE_SVC) {
        env->regs[14] = env->xregs[18];
        env->regs[13] = env->xregs[19];
    } else {
        env->banked_r14[r14_bank_number(ARM_CPU_MODE_SVC)] = env->xregs[18];
        env->banked_r13[bank_number(ARM_CPU_MODE_SVC)] = env->xregs[19];
    }

    if (mode == ARM_CPU_MODE_ABT) {
        env->regs[14] = env->xregs[20];
        env->regs[13] = env->xregs[21];
    } else {
        env->banked_r14[r14_bank_number(ARM_CPU_MODE_ABT)] = env->xregs[20];
        env->banked_r13[bank_number(ARM_CPU_MODE_ABT)] = env->xregs[21];
    }

    if (mode == ARM_CPU_MODE_UND) {
        env->regs[14] = env->xregs[22];
        env->regs[13] = env->xregs[23];
    } else {
        env->banked_r14[r14_bank_number(ARM_CPU_MODE_UND)] = env->xregs[22];
        env->banked_r13[bank_number(ARM_CPU_MODE_UND)] = env->xregs[23];
    }

    /* Registers x24-x30 are mapped to r8-r14 in FIQ mode.  If we are in FIQ
     * mode, then we can copy to r8-r14.  Otherwise, we copy to the
     * FIQ bank for r8-r14.
     */
    if (mode == ARM_CPU_MODE_FIQ) {
        for (i = 24; i < 31; i++) {
            env->regs[i - 16] = env->xregs[i];   /* X[24:30] -> R[8:14] */
        }
    } else {
        for (i = 24; i < 29; i++) {
            env->fiq_regs[i - 24] = env->xregs[i];
        }
        env->banked_r13[bank_number(ARM_CPU_MODE_FIQ)] = env->xregs[29];
        env->banked_r14[r14_bank_number(ARM_CPU_MODE_FIQ)] = env->xregs[30];
    }

    env->regs[15] = env->pc;
}